

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

bool chaiscript::Boxed_Number::greater_than_equal(Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  Result_Type RVar1;
  Boxed_Number BStack_18;
  
  oper(&BStack_18,greater_than_equal,&t_lhs->bv,&t_rhs->bv);
  RVar1 = boxed_cast<bool>(&BStack_18.bv,(Type_Conversions_State *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&BStack_18.bv.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return RVar1;
}

Assistant:

static bool greater_than_equal(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs)
      {
        return boxed_cast<bool>(oper(Operators::greater_than_equal, t_lhs.bv, t_rhs.bv));
      }